

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringRef.cpp
# Opt level: O1

size_t __thiscall llvm::StringRef::find_lower(StringRef *this,char C,size_t From)

{
  byte bVar1;
  ulong uVar2;
  size_t sVar3;
  byte bVar4;
  byte bVar5;
  
  bVar4 = C | 0x20;
  if (0x19 < (byte)(C + 0xbfU)) {
    bVar4 = C;
  }
  uVar2 = this->Length;
  if (From <= uVar2) {
    sVar3 = 0xffffffffffffffff;
    if (uVar2 != From) {
      do {
        bVar1 = this->Data[From];
        bVar5 = bVar1 | 0x20;
        if (0x19 < (byte)(bVar1 + 0xbf)) {
          bVar5 = bVar1;
        }
        sVar3 = From;
      } while ((bVar5 != bVar4) && (From = From + 1, sVar3 = 0xffffffffffffffff, uVar2 != From));
    }
    return sVar3;
  }
  __assert_fail("size() >= N && \"Dropping more elements than exist\"",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/StringRef.h"
                ,0x286,"StringRef llvm::StringRef::drop_front(size_t) const");
}

Assistant:

size_t StringRef::find_lower(char C, size_t From) const {
  char L = toLower(C);
  return find_if([L](char D) { return toLower(D) == L; }, From);
}